

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int ParseMultiChannelEXRHeaderFromMemory(EXRImage *exrImage,uchar *memory,char **err)

{
  pointer __src;
  pointer puVar1;
  int iVar2;
  char *pcVar3;
  uchar *puVar4;
  char **ppcVar5;
  int *piVar6;
  int *piVar7;
  undefined8 uVar8;
  ulong uVar10;
  pointer paVar11;
  int c;
  uchar *ptr;
  size_t __n;
  ulong uVar12;
  int iVar13;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string attrName;
  vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> customAttribs;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  channels;
  string attrType;
  EXRAttribute attrib;
  float local_12c;
  float local_128;
  float local_124;
  float local_120;
  uint local_11c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_118;
  uchar *local_100;
  string local_f8;
  float local_d8;
  float local_d4;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_c4;
  float local_c0;
  float local_bc;
  void *local_b8;
  iterator iStack_b0;
  _EXRAttribute *local_a8;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  local_98;
  undefined8 local_78;
  string local_70;
  _EXRAttribute local_50;
  undefined8 uVar9;
  
  if (exrImage == (EXRImage *)0x0 || memory == (uchar *)0x0) {
    iVar13 = -1;
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar3 = "Invalid argument.";
  }
  else {
    iVar13 = *(int *)memory;
    if (iVar13 == 0x1312f76) {
      memory = memory + 4;
    }
    else if (err != (char **)0x0) {
      *err = "Header mismatch.";
    }
    if (iVar13 != 0x1312f76) {
      return -3;
    }
    if ((((*memory == '\x02') && (memory[1] == '\0')) && (memory[2] == '\0')) && (memory[3] == '\0')
       ) {
      ptr = memory + 4;
      local_98.
      super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.
      super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.
      super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8 = (_EXRAttribute *)0x0;
      local_b8 = (void *)0x0;
      iStack_b0._M_current = (_EXRAttribute *)0x0;
      iVar13 = -3;
      local_d0 = 0.0;
      local_120 = -NAN;
      local_d4 = 0.0;
      local_d8 = 1.0;
      local_cc = 1.0;
      local_124 = -NAN;
      local_128 = -NAN;
      local_12c = -NAN;
      local_bc = -NAN;
      local_c0 = -NAN;
      local_c4 = -NAN;
      local_c8 = -NAN;
      local_78 = 0;
      local_11c = 0xffffffff;
      do {
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        local_f8._M_string_length = 0;
        local_f8.field_2._M_local_buf[0] = '\0';
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        local_70._M_string_length = 0;
        local_70.field_2._M_local_buf[0] = '\0';
        uVar9 = 0;
        uVar8 = 0;
        local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        puVar4 = (uchar *)anon_unknown.dwarf_181680::ReadAttribute
                                    (&local_f8,&local_70,&local_118,(char *)ptr);
        if (puVar4 == (uchar *)0x0) {
          ptr = ptr + 1;
          iVar2 = 2;
        }
        else {
          local_100 = puVar4;
          iVar2 = std::__cxx11::string::compare((char *)&local_f8);
          if (iVar2 == 0) {
            if (*local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start < 5) {
              iVar2 = 0;
              ptr = local_100;
            }
            else {
              iVar13 = -5;
              iVar2 = 1;
              if (err != (char **)0x0) {
                pcVar3 = "Unsupported compression type.";
LAB_0019d30d:
                iVar2 = 1;
                *err = pcVar3;
              }
            }
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)&local_f8);
            if (iVar2 == 0) {
              anon_unknown.dwarf_181680::ReadChannelInfo(&local_98,&local_118);
              local_11c = (int)((ulong)((long)local_98.
                                              super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_98.
                                             super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                          -0x55555555;
              if ((int)local_11c < 1) {
                iVar13 = -6;
                iVar2 = 1;
                if (err != (char **)0x0) {
                  pcVar3 = "Invalid channels format.";
                  goto LAB_0019d30d;
                }
              }
              else {
                iVar2 = 0;
                ptr = local_100;
              }
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)&local_f8);
              if (iVar2 == 0) {
                uVar12 = (long)local_118.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_118.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                if (uVar12 != 0) {
                  if (uVar12 < 5) {
LAB_0019d60e:
                    uVar8 = 4;
                  }
                  else if (uVar12 < 9) {
LAB_0019d615:
                    uVar8 = 8;
                  }
                  else {
                    if (0xc < uVar12) {
                      local_120 = *(float *)local_118.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start;
                      local_124 = *(float *)((long)local_118.
                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 4);
                      local_128 = *(float *)((long)local_118.
                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 8);
                      local_12c = *(float *)((long)local_118.
                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 0xc);
                      ptr = local_100;
                      goto LAB_0019d3bd;
                    }
LAB_0019d61c:
                    uVar8 = 0xc;
                  }
                }
LAB_0019d625:
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar8,uVar12);
                goto LAB_0019d636;
              }
              iVar2 = std::__cxx11::string::compare((char *)&local_f8);
              uVar8 = uVar9;
              if (iVar2 == 0) {
                uVar12 = (long)local_118.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_118.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                if (uVar12 == 0) goto LAB_0019d625;
                if (uVar12 < 5) goto LAB_0019d60e;
                if (uVar12 < 9) goto LAB_0019d615;
                if (uVar12 < 0xd) goto LAB_0019d61c;
                local_c8 = *(float *)local_118.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                local_c4 = *(float *)((long)local_118.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 4);
                local_c0 = *(float *)((long)local_118.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 8);
                local_bc = *(float *)((long)local_118.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 0xc);
                ptr = local_100;
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)&local_f8);
                if (iVar2 == 0) {
                  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish ==
                      local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start) {
LAB_0019d623:
                    uVar12 = 0;
                    goto LAB_0019d625;
                  }
                  local_78 = CONCAT71((int7)((ulong)local_118.
                                                                                                        
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 8),
                                      *local_118.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
                  ptr = local_100;
                }
                else {
                  iVar2 = std::__cxx11::string::compare((char *)&local_f8);
                  ptr = local_100;
                  if (iVar2 == 0) {
                    if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start) goto LAB_0019d623;
                    local_cc = *(float *)local_118.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start;
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare((char *)&local_f8);
                    if (iVar2 == 0) {
                      uVar12 = (long)local_118.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_118.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                      if (uVar12 == 0) goto LAB_0019d625;
                      if (uVar12 < 5) goto LAB_0019d60e;
                      local_d4 = *(float *)local_118.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                      local_d0 = *(float *)((long)local_118.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 4);
                    }
                    else {
                      iVar2 = std::__cxx11::string::compare((char *)&local_f8);
                      if (iVar2 == 0) {
                        if (local_118.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish ==
                            local_118.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start) goto LAB_0019d623;
                        local_d8 = *(float *)local_118.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start;
                      }
                      else {
                        local_50.name = strdup(local_f8._M_dataplus._M_p);
                        local_50.type = strdup(local_70._M_dataplus._M_p);
                        puVar1 = local_118.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish;
                        __src = local_118.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                        local_50.size =
                             (int)((long)local_118.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_118.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                        local_50.value =
                             (uchar *)malloc((long)local_118.
                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_118.
                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                        __n = (long)puVar1 - (long)__src;
                        if (__n == 0) {
                          uVar8 = std::__throw_out_of_range_fmt
                                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                             ,0,0);
                          if ((float *)local_118.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start != (float *)0x0) {
                            operator_delete(local_118.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_118.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_118.
                                                                                                        
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_70._M_dataplus._M_p != &local_70.field_2) {
                            operator_delete(local_70._M_dataplus._M_p,
                                            CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                                     local_70.field_2._M_local_buf[0]) + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                            operator_delete(local_f8._M_dataplus._M_p,
                                            CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                                     local_f8.field_2._M_local_buf[0]) + 1);
                          }
                          if (local_b8 != (void *)0x0) {
                            operator_delete(local_b8,(long)local_a8 - (long)local_b8);
                          }
                          std::
                          vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                          ::~vector(&local_98);
                          _Unwind_Resume(uVar8);
                        }
                        memcpy(local_50.value,__src,__n);
                        if (iStack_b0._M_current == local_a8) {
                          std::vector<_EXRAttribute,std::allocator<_EXRAttribute>>::
                          _M_realloc_insert<_EXRAttribute_const&>
                                    ((vector<_EXRAttribute,std::allocator<_EXRAttribute>> *)
                                     &local_b8,iStack_b0,&local_50);
                        }
                        else {
                          *(ulong *)&(iStack_b0._M_current)->size =
                               CONCAT44(local_50._20_4_,local_50.size);
                          (iStack_b0._M_current)->value = local_50.value;
                          (iStack_b0._M_current)->name = local_50.name;
                          (iStack_b0._M_current)->type = local_50.type;
                          iStack_b0._M_current = iStack_b0._M_current + 1;
                        }
                      }
                    }
                  }
                }
              }
LAB_0019d3bd:
              iVar2 = 0;
            }
          }
        }
        if ((float *)local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start != (float *)0x0) {
          operator_delete(local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_118.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_118.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,
                          CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                   local_70.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,
                          CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                   local_f8.field_2._M_local_buf[0]) + 1);
        }
      } while (iVar2 == 0);
      if (iVar2 == 2) {
        if ((int)local_120 < 0) {
LAB_0019d636:
          __assert_fail("dx >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0x2b0c,
                        "int ParseMultiChannelEXRHeaderFromMemory(EXRImage *, const unsigned char *, const char **)"
                       );
        }
        if ((int)local_124 < 0) {
          __assert_fail("dy >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0x2b0d,
                        "int ParseMultiChannelEXRHeaderFromMemory(EXRImage *, const unsigned char *, const char **)"
                       );
        }
        if ((int)local_128 < 0) {
          __assert_fail("dw >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0x2b0e,
                        "int ParseMultiChannelEXRHeaderFromMemory(EXRImage *, const unsigned char *, const char **)"
                       );
        }
        if ((int)local_12c < 0) {
          __assert_fail("dh >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0x2b0f,
                        "int ParseMultiChannelEXRHeaderFromMemory(EXRImage *, const unsigned char *, const char **)"
                       );
        }
        if ((int)local_11c < 1) {
          __assert_fail("numChannels >= 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0x2b10,
                        "int ParseMultiChannelEXRHeaderFromMemory(EXRImage *, const unsigned char *, const char **)"
                       );
        }
        uVar10 = (ulong)local_11c;
        ppcVar5 = (char **)malloc(uVar10 * 8);
        exrImage->channel_names = ppcVar5;
        uVar12 = 0;
        paVar11 = local_98.
                  super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          pcVar3 = strdup((paVar11->name)._M_dataplus._M_p);
          exrImage->channel_names[uVar12] = pcVar3;
          uVar12 = uVar12 + 1;
          paVar11 = paVar11 + 1;
        } while (uVar10 != uVar12);
        exrImage->num_channels = local_11c;
        exrImage->width = ((int)local_128 - (int)local_120) + 1;
        exrImage->height = ((int)local_12c - (int)local_124) + 1;
        exrImage->pixel_aspect_ratio = local_cc;
        exrImage->screen_window_center[0] = local_d4;
        exrImage->screen_window_center[1] = local_d0;
        exrImage->screen_window_width = local_d8;
        exrImage->display_window[0] = (int)local_c8;
        exrImage->display_window[1] = (int)local_c4;
        exrImage->display_window[2] = (int)local_c0;
        exrImage->display_window[3] = (int)local_bc;
        exrImage->data_window[0] = (int)local_120;
        exrImage->data_window[1] = (int)local_124;
        exrImage->data_window[2] = (int)local_128;
        exrImage->data_window[3] = (int)local_12c;
        exrImage->line_order = (uint)(byte)local_78;
        piVar6 = (int *)malloc(uVar10 * 4);
        exrImage->pixel_types = piVar6;
        piVar7 = &(local_98.
                   super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start)->pixelType;
        uVar12 = 0;
        do {
          piVar6[uVar12] = *piVar7;
          uVar12 = uVar12 + 1;
          piVar7 = piVar7 + 0xc;
        } while (uVar10 != uVar12);
        piVar6 = (int *)malloc(uVar10 * 4);
        exrImage->requested_pixel_types = piVar6;
        uVar12 = 1;
        if (1 < (int)local_11c) {
          uVar12 = (ulong)local_11c;
        }
        piVar7 = &(local_98.
                   super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start)->pixelType;
        iVar13 = 0;
        uVar10 = 0;
        do {
          piVar6[uVar10] = *piVar7;
          uVar10 = uVar10 + 1;
          piVar7 = piVar7 + 0xc;
        } while (uVar12 != uVar10);
      }
      if (local_b8 != (void *)0x0) {
        operator_delete(local_b8,(long)local_a8 - (long)local_b8);
      }
      std::
      vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ::~vector(&local_98);
      return iVar13;
    }
    iVar13 = -4;
    if (err == (char **)0x0) {
      return -4;
    }
    pcVar3 = "Unsupported version or scanline.";
  }
  *err = pcVar3;
  return iVar13;
}

Assistant:

int ParseMultiChannelEXRHeaderFromMemory(EXRImage *exrImage,
                                         const unsigned char *memory,
                                         const char **err) {
  if (exrImage == NULL || memory == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return -1;
  }

  const char *buf = reinterpret_cast<const char *>(memory);

  const char *marker = &buf[0];

  // Header check.
  {
    const char header[] = {0x76, 0x2f, 0x31, 0x01};

    if (memcmp(marker, header, 4) != 0) {
      if (err) {
        (*err) = "Header mismatch.";
      }
      return -3;
    }
    marker += 4;
  }

  // Version, scanline.
  {
    // must be [2, 0, 0, 0]
    if (marker[0] != 2 || marker[1] != 0 || marker[2] != 0 || marker[3] != 0) {
      if (err) {
        (*err) = "Unsupported version or scanline.";
      }
      return -4;
    }

    marker += 4;
  }

  int dx = -1;
  int dy = -1;
  int dw = -1;
  int dh = -1;
  int numChannels = -1;
  int displayWindow[4] = {-1, -1, -1, -1}; // @fixme.
  float screenWindowCenter[2] = {0.0f, 0.0f}; // @fixme
  float screenWindowWidth = 1.0f; // @fixme
  float pixelAspectRatio = 1.0f;
  unsigned char lineOrder = 0; // 0 -> increasing y; 1 -> decreasing
  std::vector<ChannelInfo> channels;

  int numCustomAttributes = 0;
  std::vector<EXRAttribute> customAttribs;

  // Read attributes
  for (;;) {
    std::string attrName;
    std::string attrType;
    std::vector<unsigned char> data;
    const char *marker_next = ReadAttribute(attrName, attrType, data, marker);
    if (marker_next == NULL) {
      marker++; // skip '\0'
      break;
    }

    if (attrName.compare("compression") == 0) {
      // must be 0:No compression, 1: RLE, 2: ZIPs, 3: ZIP or 4: PIZ
      if (data[0] > 4) {
        if (err) {
          (*err) = "Unsupported compression type.";
        }
        return -5;
      }

    } else if (attrName.compare("channels") == 0) {

      // name: zero-terminated string, from 1 to 255 bytes long
      // pixel type: int, possible values are: UINT = 0 HALF = 1 FLOAT = 2
      // pLinear: unsigned char, possible values are 0 and 1
      // reserved: three chars, should be zero
      // xSampling: int
      // ySampling: int

      ReadChannelInfo(channels, data);

      numChannels = channels.size();

      if (numChannels < 1) {
        if (err) {
          (*err) = "Invalid channels format.";
        }
        return -6;
      }

    } else if (attrName.compare("dataWindow") == 0) {
      memcpy(&dx, &data.at(0), sizeof(int));
      memcpy(&dy, &data.at(4), sizeof(int));
      memcpy(&dw, &data.at(8), sizeof(int));
      memcpy(&dh, &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&dx));
        swap4(reinterpret_cast<unsigned int *>(&dy));
        swap4(reinterpret_cast<unsigned int *>(&dw));
        swap4(reinterpret_cast<unsigned int *>(&dh));
      }
    } else if (attrName.compare("displayWindow") == 0) {
      memcpy(&displayWindow[0], &data.at(0), sizeof(int));
      memcpy(&displayWindow[1], &data.at(4), sizeof(int));
      memcpy(&displayWindow[2], &data.at(8), sizeof(int));
      memcpy(&displayWindow[3], &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[0]));
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[1]));
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[2]));
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[3]));
      }
    } else if (attrName.compare("lineOrder") == 0) {
      memcpy(&lineOrder, &data.at(0), sizeof(lineOrder));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&lineOrder));
      }
    } else if (attrName.compare("pixelAspectRatio") == 0) {
      memcpy(&pixelAspectRatio, &data.at(0), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&pixelAspectRatio));
      }
    } else if (attrName.compare("screenWindowCenter") == 0) {
      memcpy(&screenWindowCenter[0], &data.at(0), sizeof(float));
      memcpy(&screenWindowCenter[1], &data.at(4), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&screenWindowCenter[0]));
        swap4(reinterpret_cast<unsigned int *>(&screenWindowCenter[1]));
      }
    } else if (attrName.compare("screenWindowWidth") == 0) {
      memcpy(&screenWindowWidth, &data.at(0), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&screenWindowWidth));
      }
    } else {
      // Custom attribute(up to TINYEXR_MAX_ATTRIBUTES)
      if (numCustomAttributes < TINYEXR_MAX_ATTRIBUTES) {
        EXRAttribute attrib;
        attrib.name = strdup(attrName.c_str());
        attrib.type = strdup(attrType.c_str());
        attrib.size = data.size();
        attrib.value = (unsigned char*)malloc(data.size());
        memcpy((char*)attrib.value, &data.at(0), data.size());
        customAttribs.push_back(attrib);
      }
    }

    marker = marker_next;
  }

  assert(dx >= 0);
  assert(dy >= 0);
  assert(dw >= 0);
  assert(dh >= 0);
  assert(numChannels >= 1);

  int dataWidth = dw - dx + 1;
  int dataHeight = dh - dy + 1;

  {
    exrImage->channel_names =
        (const char **)malloc(sizeof(const char *) * numChannels);
    for (int c = 0; c < numChannels; c++) {
#ifdef _WIN32
      exrImage->channel_names[c] = _strdup(channels[c].name.c_str());
#else
      exrImage->channel_names[c] = strdup(channels[c].name.c_str());
#endif
    }
    exrImage->num_channels = numChannels;

    exrImage->width = dataWidth;
    exrImage->height = dataHeight;
    exrImage->pixel_aspect_ratio = pixelAspectRatio;
    exrImage->screen_window_center[0] = screenWindowCenter[0];
    exrImage->screen_window_center[1] = screenWindowCenter[1];
    exrImage->screen_window_width = screenWindowWidth;
    exrImage->display_window[0] = displayWindow[0];
    exrImage->display_window[1] = displayWindow[1];
    exrImage->display_window[2] = displayWindow[2];
    exrImage->display_window[3] = displayWindow[3];
    exrImage->data_window[0] = dx;
    exrImage->data_window[1] = dy;
    exrImage->data_window[2] = dw;
    exrImage->data_window[3] = dh;
    exrImage->line_order = lineOrder;

    exrImage->pixel_types = (int *)malloc(sizeof(int) * numChannels);
    for (int c = 0; c < numChannels; c++) {
      exrImage->pixel_types[c] = channels[c].pixelType;
    }

    // Initially fill with values of `pixel-types`
    exrImage->requested_pixel_types = (int *)malloc(sizeof(int) * numChannels);
    for (int c = 0; c < numChannels; c++) {
      exrImage->requested_pixel_types[c] = channels[c].pixelType;
    }
  }

  if (numCustomAttributes > 0) {
    assert(customAttribs.size() < TINYEXR_MAX_ATTRIBUTES);
    exrImage->num_custom_attributes = numCustomAttributes;

    for (int i = 0; i < (int)customAttribs.size(); i++) {
      exrImage->custom_attributes[i] = customAttribs[i];
    }
  } 

  return 0; // OK
}